

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

Type * __thiscall
soul::AST::BinaryOperator::getResultType(Type *__return_storage_ptr__,BinaryOperator *this)

{
  Structure *pSVar1;
  Category CVar2;
  bool bVar3;
  bool bVar4;
  PrimitiveType PVar5;
  BoundedIntSize BVar6;
  
  resolveOpTypes(this);
  CVar2 = (this->resolvedOpTypes).resultType.arrayElementCategory;
  bVar3 = (this->resolvedOpTypes).resultType.isRef;
  bVar4 = (this->resolvedOpTypes).resultType.isConstant;
  PVar5.type = (this->resolvedOpTypes).resultType.primitiveType.type;
  __return_storage_ptr__->category = (this->resolvedOpTypes).resultType.category;
  __return_storage_ptr__->arrayElementCategory = CVar2;
  __return_storage_ptr__->isRef = bVar3;
  __return_storage_ptr__->isConstant = bVar4;
  __return_storage_ptr__->primitiveType = (PrimitiveType)PVar5.type;
  BVar6 = (this->resolvedOpTypes).resultType.arrayElementBoundingSize;
  __return_storage_ptr__->boundingSize = (this->resolvedOpTypes).resultType.boundingSize;
  __return_storage_ptr__->arrayElementBoundingSize = BVar6;
  pSVar1 = (this->resolvedOpTypes).resultType.structure.object;
  (__return_storage_ptr__->structure).object = pSVar1;
  if (pSVar1 != (Structure *)0x0) {
    (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

Type getResultType() const override         { resolveOpTypes(); return resolvedOpTypes.resultType; }